

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3GenerateColumnNames(Parse *pParse,Select *pSelect)

{
  sqlite3 *db_00;
  int *piVar1;
  char *pcVar2;
  undefined8 *puVar3;
  long in_RSI;
  undefined8 *in_RDI;
  bool bVar4;
  bool bVar5;
  char *z;
  char *zName_1;
  int iCol;
  char *zCol;
  char *zName;
  Expr *p;
  int srcName;
  int fullName;
  sqlite3 *db;
  ExprList *pEList;
  SrcList *pTabList;
  Table *pTab;
  int i;
  Vdbe *v;
  undefined8 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar6;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  int idx;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SrcList *in_stack_ffffffffffffffa0;
  Parse *in_stack_ffffffffffffffa8;
  int local_1c;
  long local_10;
  
  db_00 = (sqlite3 *)*in_RDI;
  local_10 = in_RSI;
  if (*(char *)((long)in_RDI + 0x1c) == '\0') {
    for (; *(long *)(local_10 + 0x50) != 0; local_10 = *(long *)(local_10 + 0x50)) {
    }
    piVar1 = *(int **)(local_10 + 0x20);
    *(undefined1 *)((long)in_RDI + 0x1c) = 1;
    bVar4 = (db_00->flags & 4) != 0;
    bVar5 = (db_00->flags & 0x40) != 0;
    uVar6 = bVar5 || bVar4;
    sqlite3VdbeSetNumCols
              ((Vdbe *)CONCAT17(uVar6,in_stack_ffffffffffffff80),
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    for (local_1c = 0; local_1c < *piVar1; local_1c = local_1c + 1) {
      pcVar2 = *(char **)(piVar1 + (long)local_1c * 6 + 2);
      idx = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      if ((*(long *)(piVar1 + (long)local_1c * 6 + 4) == 0) ||
         ((*(ushort *)((long)piVar1 + (long)local_1c * 0x18 + 0x19) & 3) != 0)) {
        if ((bVar5 || bVar4) && (*pcVar2 == -0x58)) {
          in_stack_ffffffffffffff9c = (int)*(short *)(pcVar2 + 0x30);
          puVar3 = *(undefined8 **)(pcVar2 + 0x40);
          if (in_stack_ffffffffffffff9c < 0) {
            in_stack_ffffffffffffff9c = (int)*(short *)((long)puVar3 + 0x34);
          }
          if (in_stack_ffffffffffffff9c < 0) {
            in_stack_ffffffffffffffa0 = (SrcList *)0x2b2456;
          }
          else {
            in_stack_ffffffffffffffa0 =
                 *(SrcList **)(puVar3[1] + (long)in_stack_ffffffffffffff9c * 0x10);
          }
          if (bVar4) {
            in_stack_ffffffffffffff90 =
                 sqlite3MPrintf(db_00,"%s.%s",*puVar3,in_stack_ffffffffffffffa0);
            sqlite3VdbeSetColName
                      ((Vdbe *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (_func_void_void_ptr *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
          }
          else {
            sqlite3VdbeSetColName
                      ((Vdbe *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),idx,
                       (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (_func_void_void_ptr *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
          }
        }
        else {
          if (*(sqlite3 **)(piVar1 + (long)local_1c * 6 + 4) == (sqlite3 *)0x0) {
            in_stack_ffffffffffffff88 = sqlite3MPrintf(db_00,"column%d",(ulong)(local_1c + 1));
          }
          else {
            in_stack_ffffffffffffff88 =
                 sqlite3DbStrDup(*(sqlite3 **)(piVar1 + (long)local_1c * 6 + 4),
                                 (char *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
          }
          sqlite3VdbeSetColName
                    ((Vdbe *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88,
                     (_func_void_void_ptr *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
        }
      }
      else {
        in_stack_ffffffffffffffa8 = *(Parse **)(piVar1 + (long)local_1c * 6 + 4);
        sqlite3VdbeSetColName
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),idx,
                   (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (_func_void_void_ptr *)CONCAT17(uVar6,in_stack_ffffffffffffff80));
      }
    }
    generateColumnTypes(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        (ExprList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateColumnNames(
  Parse *pParse,      /* Parser context */
  Select *pSelect     /* Generate column names for this SELECT statement */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  Table *pTab;
  SrcList *pTabList;
  ExprList *pEList;
  sqlite3 *db = pParse->db;
  int fullName;    /* TABLE.COLUMN if no AS clause and is a direct table ref */
  int srcName;     /* COLUMN or TABLE.COLUMN if no AS clause and is direct */

  if( pParse->colNamesSet ) return;
  /* Column names are determined by the left-most term of a compound select */
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  TREETRACE(0x80,pParse,pSelect,("generating column names\n"));
  pTabList = pSelect->pSrc;
  pEList = pSelect->pEList;
  assert( v!=0 );
  assert( pTabList!=0 );
  pParse->colNamesSet = 1;
  fullName = (db->flags & SQLITE_FullColNames)!=0;
  srcName = (db->flags & SQLITE_ShortColNames)!=0 || fullName;
  sqlite3VdbeSetNumCols(v, pEList->nExpr);
  for(i=0; i<pEList->nExpr; i++){
    Expr *p = pEList->a[i].pExpr;

    assert( p!=0 );
    assert( p->op!=TK_AGG_COLUMN );  /* Agg processing has not run yet */
    assert( p->op!=TK_COLUMN
        || (ExprUseYTab(p) && p->y.pTab!=0) ); /* Covering idx not yet coded */
    if( pEList->a[i].zEName && pEList->a[i].fg.eEName==ENAME_NAME ){
      /* An AS clause always takes first priority */
      char *zName = pEList->a[i].zEName;
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_TRANSIENT);
    }else if( srcName && p->op==TK_COLUMN ){
      char *zCol;
      int iCol = p->iColumn;
      pTab = p->y.pTab;
      assert( pTab!=0 );
      if( iCol<0 ) iCol = pTab->iPKey;
      assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
      if( iCol<0 ){
        zCol = "rowid";
      }else{
        zCol = pTab->aCol[iCol].zCnName;
      }
      if( fullName ){
        char *zName = 0;
        zName = sqlite3MPrintf(db, "%s.%s", pTab->zName, zCol);
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zName, SQLITE_DYNAMIC);
      }else{
        sqlite3VdbeSetColName(v, i, COLNAME_NAME, zCol, SQLITE_TRANSIENT);
      }
    }else{
      const char *z = pEList->a[i].zEName;
      z = z==0 ? sqlite3MPrintf(db, "column%d", i+1) : sqlite3DbStrDup(db, z);
      sqlite3VdbeSetColName(v, i, COLNAME_NAME, z, SQLITE_DYNAMIC);
    }
  }
  generateColumnTypes(pParse, pTabList, pEList);
}